

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_io.cpp
# Opt level: O2

string * __thiscall
libtorrent::aux::print_endpoint_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,address *addr,int port)

{
  char *pcVar1;
  char buf [200];
  string local_108;
  char local_e8 [208];
  
  if (*(int *)this == 1) {
    boost::asio::ip::address::to_string_abi_cxx11_(&local_108,(address *)this);
    pcVar1 = "  [%s]:%d";
  }
  else {
    boost::asio::ip::address::to_string_abi_cxx11_(&local_108,(address *)this);
    pcVar1 = "  %s:%d";
  }
  snprintf(local_e8,200,pcVar1 + 2,local_108._M_dataplus._M_p,(ulong)addr & 0xffffffff);
  ::std::__cxx11::string::~string((string *)&local_108);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_e8,(allocator<char> *)&local_108);
  return __return_storage_ptr__;
}

Assistant:

std::string print_endpoint(address const& addr, int port)
	{
		char buf[200];
		if (addr.is_v6())
			std::snprintf(buf, sizeof(buf), "[%s]:%d", addr.to_string().c_str(), port);
		else
			std::snprintf(buf, sizeof(buf), "%s:%d", addr.to_string().c_str(), port);
		return buf;
	}